

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode Curl_mime_set_subparts(curl_mimepart *part,curl_mime *subparts,int take_ownership)

{
  Curl_easy *data;
  curl_mimepart *pcVar1;
  curl_mime *pcVar2;
  CURLcode CVar3;
  curl_mime *pcVar4;
  code *pcVar5;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if ((part->kind == MIMEKIND_MULTIPART) && ((curl_mime *)part->arg == subparts)) {
    return CURLE_OK;
  }
  if (part->freefunc != (curl_free_callback)0x0) {
    (*part->freefunc)(part->arg);
  }
  part->readfunc = (curl_read_callback)0x0;
  part->seekfunc = (curl_seek_callback)0x0;
  CVar3 = CURLE_OK;
  part->freefunc = (curl_free_callback)0x0;
  part->arg = part;
  part->data = (char *)0x0;
  part->fp = (FILE *)0x0;
  part->datasize = 0;
  (part->encstate).pos = 0;
  (part->encstate).bufbeg = 0;
  (part->encstate).bufend = 0;
  part->kind = MIMEKIND_NONE;
  if (subparts == (curl_mime *)0x0) {
    return CURLE_OK;
  }
  data = part->easy;
  if (((data == (Curl_easy *)0x0) || (subparts->easy == (Curl_easy *)0x0 || data == subparts->easy))
     && (subparts->parent == (curl_mimepart *)0x0)) {
    pcVar2 = part->parent;
    if (part->parent != (curl_mime *)0x0) {
      do {
        pcVar4 = pcVar2;
        pcVar1 = pcVar4->parent;
        if (pcVar1 == (curl_mimepart *)0x0) break;
        pcVar2 = pcVar1->parent;
      } while (pcVar2 != (curl_mime *)0x0);
      if (pcVar4 == subparts) {
        if (data != (Curl_easy *)0x0) {
          Curl_failf(data,"Can\'t add itself as a subpart!");
        }
        goto LAB_0042e532;
      }
    }
    subparts->parent = part;
    part->readfunc = mime_subparts_read;
    part->seekfunc = mime_subparts_seek;
    pcVar5 = mime_subparts_free;
    if (take_ownership == 0) {
      pcVar5 = mime_subparts_unbind;
    }
    part->freefunc = pcVar5;
    part->arg = subparts;
    part->datasize = -1;
    part->kind = MIMEKIND_MULTIPART;
  }
  else {
LAB_0042e532:
    CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_mime_set_subparts(curl_mimepart *part,
                                curl_mime *subparts, int take_ownership)
{
  curl_mime *root;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* Accept setting twice the same subparts. */
  if(part->kind == MIMEKIND_MULTIPART && part->arg == subparts)
    return CURLE_OK;

  cleanup_part_content(part);

  if(subparts) {
    /* Must belong to the same data handle. */
    if(part->easy && subparts->easy && part->easy != subparts->easy)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    /* Should not have been attached already. */
    if(subparts->parent)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    /* Should not be the part's root. */
    root = part->parent;
    if(root) {
      while(root->parent && root->parent->parent)
        root = root->parent->parent;
      if(subparts == root) {
        if(part->easy)
          failf(part->easy, "Can't add itself as a subpart!");
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }

    subparts->parent = part;
    part->readfunc = mime_subparts_read;
    part->seekfunc = mime_subparts_seek;
    part->freefunc = take_ownership? mime_subparts_free: mime_subparts_unbind;
    part->arg = subparts;
    part->datasize = -1;
    part->kind = MIMEKIND_MULTIPART;
  }

  return CURLE_OK;
}